

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.cpp
# Opt level: O2

QString * language::boolValue(QString *__return_storage_ptr__,bool v)

{
  undefined1 *other;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (_language == 0) {
    other = cppFalse;
    if (v) {
      other = cppTrue;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_10) goto LAB_001492ca;
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&__return_storage_ptr__->d,(QArrayDataPointer<char16_t> *)other);
  }
  else {
    if (v) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = L"True";
      (__return_storage_ptr__->d).size = 4;
    }
    else {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = L"False";
      (__return_storage_ptr__->d).size = 5;
    }
    local_28.size = 0;
    local_28.ptr = (char16_t *)0x0;
    local_28.d = (Data *)0x0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
LAB_001492ca:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString boolValue(bool v)
{
    switch (language()) {
    case Language::Cpp:
        return v ? cppTrue : cppFalse;
    case Language::Python:
        return v ? QStringLiteral("True") : QStringLiteral("False");
    }
    Q_UNREACHABLE();
}